

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O2

void __thiscall
eos::fitting::RenderingParameters::RenderingParameters
          (RenderingParameters *this,ScaledOrthoProjectionParameters *ortho_params,int screen_width,
          int screen_height)

{
  float fVar1;
  
  this->camera_type = Orthographic;
  (this->frustum).l = -1.0;
  (this->frustum).r = 1.0;
  (this->frustum).b = -1.0;
  (this->frustum).t = 1.0;
  fVar1 = ortho_params->ty;
  this->t_x = ortho_params->tx;
  this->t_y = fVar1;
  (this->t_z).super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>
  ._M_engaged = false;
  (this->fov_y).super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float>._M_engaged = false;
  this->screen_width = screen_width;
  this->screen_height = screen_height;
  Eigen::internal::quaternionbase_assign_impl<Eigen::Matrix<float,3,3,0,3,3>,3,3>::
  run<Eigen::Quaternion<float,0>>
            ((QuaternionBase<Eigen::Quaternion<float,_0>_> *)&this->rotation,&ortho_params->R);
  fVar1 = ortho_params->s;
  (this->frustum).l = 0.0;
  (this->frustum).r = (float)screen_width / fVar1;
  (this->frustum).b = 0.0;
  (this->frustum).t = (float)screen_height / fVar1;
  return;
}

Assistant:

RenderingParameters(ScaledOrthoProjectionParameters ortho_params, int screen_width, int screen_height)
        : camera_type(CameraType::Orthographic), t_x(ortho_params.tx), t_y(ortho_params.ty),
          screen_width(screen_width), screen_height(screen_height)
    {
        rotation = ortho_params.R; // converts the rotation matrix to a quaternion

        const float l = 0.0f;
        const float r = screen_width / ortho_params.s;
        const float b = 0.0f; // The b and t values are not tested for what happens if the SOP parameters
        const float t = screen_height / ortho_params.s; // were estimated on a non-flipped viewport.
        frustum = Frustum(l, r, b, t);
    }